

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcess.cpp
# Opt level: O0

void __thiscall
MultiAgentDecisionProcess::SetNrAgents(MultiAgentDecisionProcess *this,size_t nrAgents)

{
  Agent *this_00;
  ulong in_RSI;
  long in_RDI;
  Index i;
  value_type *__x;
  Index i_00;
  undefined4 in_stack_ffffffffffffff18;
  uint uVar1;
  string *name;
  Agent *in_stack_ffffffffffffff30;
  string local_c8 [8];
  allocator<char> *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  undefined1 local_91 [125];
  uint local_14;
  ulong local_10;
  
  *(ulong *)(in_RDI + 0x50) = in_RSI;
  local_10 = in_RSI;
  std::vector<Agent,_std::allocator<Agent>_>::clear
            ((vector<Agent,_std::allocator<Agent>_> *)0xaa2de9);
  for (local_14 = 0; local_14 < local_10; local_14 = local_14 + 1) {
    this_00 = (Agent *)(in_RDI + 0x58);
    name = (string *)local_91;
    uVar1 = local_14;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    __x = (value_type *)&stack0xffffffffffffff37;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    Agent::Agent(in_stack_ffffffffffffff30,(Index)((ulong)in_RDI >> 0x20),name,
                 (string *)CONCAT44(uVar1,in_stack_ffffffffffffff18));
    std::vector<Agent,_std::allocator<Agent>_>::push_back
              ((vector<Agent,_std::allocator<Agent>_> *)this_00,__x);
    i_00 = (Index)((ulong)__x >> 0x20);
    Agent::~Agent(this_00);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff37);
    std::__cxx11::string::~string((string *)(local_91 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_91);
    Scope::Insert((Scope *)this_00,i_00);
  }
  return;
}

Assistant:

void MultiAgentDecisionProcess::SetNrAgents(size_t nrAgents) 
{
    _m_nrAgents = nrAgents;
    _m_agents.clear();
    for(Index i = 0; i < nrAgents; i++)
    {
        _m_agents.push_back(Agent(i));
        _m_allAgentsScope.Insert(i);
    }
}